

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_color_hex_rgb(char *output,nk_color col)

{
  char cVar1;
  char local_2c;
  char local_24;
  char local_20;
  char local_1c;
  char *output_local;
  nk_color col_local;
  
  if ((uint)((int)((uint)col & 0xf0) >> 4) < 10) {
    local_1c = (char)((int)((uint)col & 0xf0) >> 4) + '0';
  }
  else {
    local_1c = (char)((int)((uint)col & 0xf0) >> 4) + '7';
  }
  *output = local_1c;
  if (((uint)col & 0xf) < 10) {
    local_20 = (col.r & 0xf) + 0x30;
  }
  else {
    local_20 = (col.r & 0xf) + 0x37;
  }
  output[1] = local_20;
  output_local._5_1_ = col.g;
  if ((uint)((int)(output_local._5_1_ & 0xf0) >> 4) < 10) {
    local_24 = (char)((int)(output_local._5_1_ & 0xf0) >> 4) + '0';
  }
  else {
    local_24 = (char)((int)(output_local._5_1_ & 0xf0) >> 4) + '7';
  }
  output[2] = local_24;
  if ((output_local._5_1_ & 0xf) < 10) {
    cVar1 = (output_local._5_1_ & 0xf) + 0x30;
  }
  else {
    cVar1 = (output_local._5_1_ & 0xf) + 0x37;
  }
  output[3] = cVar1;
  output_local._6_1_ = col.b;
  if ((uint)((int)(output_local._6_1_ & 0xf0) >> 4) < 10) {
    local_2c = (char)((int)(output_local._6_1_ & 0xf0) >> 4) + '0';
  }
  else {
    local_2c = (char)((int)(output_local._6_1_ & 0xf0) >> 4) + '7';
  }
  output[4] = local_2c;
  if ((output_local._6_1_ & 0xf) < 10) {
    cVar1 = (output_local._6_1_ & 0xf) + 0x30;
  }
  else {
    cVar1 = (output_local._6_1_ & 0xf) + 0x37;
  }
  output[5] = cVar1;
  output[6] = '\0';
  return;
}

Assistant:

NK_API void
nk_color_hex_rgb(char *output, struct nk_color col)
{
    #define NK_TO_HEX(i) ((i) <= 9 ? '0' + (i): 'A' - 10 + (i))
    output[0] = (char)NK_TO_HEX((col.r & 0xF0) >> 4);
    output[1] = (char)NK_TO_HEX((col.r & 0x0F));
    output[2] = (char)NK_TO_HEX((col.g & 0xF0) >> 4);
    output[3] = (char)NK_TO_HEX((col.g & 0x0F));
    output[4] = (char)NK_TO_HEX((col.b & 0xF0) >> 4);
    output[5] = (char)NK_TO_HEX((col.b & 0x0F));
    output[6] = '\0';
    #undef NK_TO_HEX
}